

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O3

uint_t flexfloat_get_bits(flexfloat_t *a)

{
  byte bVar1;
  fp_t fVar2;
  ulong exp;
  uint_t uVar3;
  
  exp = flexfloat_exp(a);
  fVar2 = a->value;
  bVar1 = (a->desc).frac_bits;
  uVar3 = ((ulong)fVar2 & 0xfffffffffffff) >> (0x34 - bVar1 & 0x3f);
  if (exp == 0x7ff) {
    exp = ~(-1L << ((a->desc).exp_bits & 0x3f));
  }
  else if ((long)exp < 1) {
    uVar3 = flexfloat_denorm_frac(a,exp);
    exp = 0;
  }
  return (exp << (bVar1 & 0x3f)) + uVar3 +
         (((ulong)fVar2 >> 0x3f) << ((char)*(undefined4 *)&a->desc + bVar1 & 0x3f));
}

Assistant:

uint_t flexfloat_get_bits(flexfloat_t *a)
{
    int_fast16_t exp = flexfloat_exp(a);
    uint_t frac = flexfloat_frac(a);

    if(exp == INF_EXP)
        exp = flexfloat_inf_exp(a->desc);
    else if(exp <= 0) {
        frac = flexfloat_denorm_frac(a, exp);
        exp = 0;
    }

    return ((uint_t)flexfloat_sign(a) << (a->desc.exp_bits + a->desc.frac_bits))
           + ((uint_t)exp << a->desc.frac_bits)
           + frac;
}